

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

string * __thiscall
miniros::console::Formatter::getTokenStrings_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,void *logger_handle,Level level,char *str,
          char *file,char *function,int line)

{
  element_type *peVar1;
  string *psVar2;
  pointer psVar3;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (psVar3 = (this->tokens_).
                super__Vector_base<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 = local_1c0,
      psVar3 != (this->tokens_).
                super__Vector_base<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
    peVar1 = (psVar3->super___shared_ptr<miniros::console::Token,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar1->_vptr_Token[2])
              (&local_1e0,peVar1,logger_handle,(ulong)level,str,file,function,(ulong)(uint)line);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1e0,local_1d8);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string Formatter::getTokenStrings(void *logger_handle, Level level,
    const char *str, const char *file,
    const char *function, int line) const
{
  std::stringstream ss;

  for (V_Token::const_iterator it = tokens_.begin(); it != tokens_.end(); ++it)
  {
    ss << (*it)->getString(logger_handle, level, str, file, function, line);
  }

  return ss.str();
}